

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

void __thiscall
ASDCP::MXF::ASDCP_MCAConfigParser::ASDCP_MCAConfigParser(ASDCP_MCAConfigParser *this,Dictionary *d)

{
  mca_label_map_t *this_00;
  _Rb_tree_header *p_Var1;
  MDDEntry *pMVar2;
  allocator<char> local_3f1;
  string local_3f0;
  label_traits local_3d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_388;
  UL local_320;
  UL local_300;
  UL local_2e0;
  UL local_2c0;
  UL local_2a0;
  UL local_280;
  UL local_260;
  UL local_240;
  UL local_220;
  UL local_200;
  UL local_1e0;
  UL local_1c0;
  UL local_1a0;
  UL local_180;
  UL local_160;
  UL local_140;
  UL local_120;
  UL local_100;
  UL local_e0;
  UL local_c0;
  UL local_a0;
  UL local_80;
  UL local_60;
  UL local_40;
  
  (this->super_InterchangeObject_list_t).
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  (this->super_InterchangeObject_list_t).
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  (this->super_InterchangeObject_list_t).
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node._M_size = 0;
  this_00 = &this->m_LabelMap;
  p_Var1 = &(this->m_LabelMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_LabelMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_LabelMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_LabelMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_LabelMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_LabelMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_ChannelCount = 0;
  this->m_Dict = d;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"Left",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_L);
  local_40.super_Identifier<16U>.m_HasValue = true;
  local_40.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_40.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_40.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_40);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[2],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [2])0x1d8bef,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"Right",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_R);
  local_60.super_Identifier<16U>.m_HasValue = true;
  local_60.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_60.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_60.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_60);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[2],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [2])0x1d9828,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"Center",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_C);
  local_80.super_Identifier<16U>.m_HasValue = true;
  local_80.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_80.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_80.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_80);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[2],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [2])0x1d7f1f,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"LFE",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_LFE);
  local_a0.super_Identifier<16U>.m_HasValue = true;
  local_a0.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_a0.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_a0.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_a0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [4])0x1d74ec,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Left Surround",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_Ls);
  local_c0.super_Identifier<16U>.m_HasValue = true;
  local_c0.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_c0.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_c0.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_c0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [3])0x1d74ff,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Right Surround",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_Rs);
  local_e0.super_Identifier<16U>.m_HasValue = true;
  local_e0.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_e0.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_e0.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_e0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [3])0x1d7511,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Left Side Surround",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_Lss);
  local_100.super_Identifier<16U>.m_HasValue = true;
  local_100.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_100.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_100.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_100);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [4])0x1d7523,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Right Side Surround",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_Rss);
  local_120.super_Identifier<16U>.m_HasValue = true;
  local_120.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_120.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_120.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_120);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [4])0x1d7536,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Left Rear Surround",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_Lrs);
  local_140.super_Identifier<16U>.m_HasValue = true;
  local_140.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_140.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_140.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_140);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [4])0x1d7549,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Right Rear Surround",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_Rrs);
  local_160.super_Identifier<16U>.m_HasValue = true;
  local_160.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_160.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_160.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_160);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [4])0x1d755c,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"Left Center",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_Lc);
  local_180.super_Identifier<16U>.m_HasValue = true;
  local_180.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_180.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_180.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_180);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [3])0x1d756f,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"Right Center",&local_3f1)
  ;
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_Rc);
  local_1a0.super_Identifier<16U>.m_HasValue = true;
  local_1a0.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_1a0.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_1a0.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_1a0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [3])0x1d7581,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Center Surround",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_Cs);
  local_1c0.super_Identifier<16U>.m_HasValue = true;
  local_1c0.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_1c0.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_1c0.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_1c0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [3])0x1d7593,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Hearing Impaired",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_HI);
  local_1e0.super_Identifier<16U>.m_HasValue = true;
  local_1e0.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_1e0.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_1e0.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_1e0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [3])0x1d77dd,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Visually Impaired-Narrative",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_VIN);
  local_200.super_Identifier<16U>.m_HasValue = true;
  local_200.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_200.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_200.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_200);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [4])0x1d77f3,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"5.1",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioSoundfield_51);
  local_220.super_Identifier<16U>.m_HasValue = true;
  local_220.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_220.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_220.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_220);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [3])0x1d75cd,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"7.1DS",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioSoundfield_71);
  local_240.super_Identifier<16U>.m_HasValue = true;
  local_240.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_240.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_240.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_240);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [3])0x1d75e2,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"7.1SDS",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioSoundfield_SDS);
  local_260.super_Identifier<16U>.m_HasValue = true;
  local_260.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_260.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_260.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_260);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [4])0x1db573,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"6.1",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioSoundfield_61);
  local_280.super_Identifier<16U>.m_HasValue = true;
  local_280.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_280.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_280.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_280);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [3])0x1d97bb,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"1.0 Monaural",&local_3f1)
  ;
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioSoundfield_M);
  local_2a0.super_Identifier<16U>.m_HasValue = true;
  local_2a0.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_2a0.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_2a0.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_2a0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[2],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [2])0x1d97f7,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"FSK Sync",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_FSKSyncSignalChannel);
  local_2c0.super_Identifier<16U>.m_HasValue = true;
  local_2c0.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_2c0.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_2c0.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,true,&local_2c0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[8],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [8])"FSKSync",&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"D-BOX Motion Code Primary Stream",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DBOXMotionCodePrimaryStream);
  local_2e0.super_Identifier<16U>.m_HasValue = true;
  local_2e0.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_2e0.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_2e0.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,false,&local_2e0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[5],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [5])"DBOX",&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"D-BOX Motion Code Secondary Stream",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_DBOXMotionCodeSecondaryStream);
  local_300.super_Identifier<16U>.m_HasValue = true;
  local_300.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_300.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_300.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,false,&local_300);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[6],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [6])"DBOX2",&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Sign Language Video Stream",&local_3f1);
  pMVar2 = Dictionary::Type(this->m_Dict,MDD_AudioChannelSLVS);
  local_320.super_Identifier<16U>.m_HasValue = true;
  local_320.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
  local_320.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
  local_320.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  label_traits::label_traits(&local_3d0,&local_3f0,false,&local_320);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[5],_ASDCP::MXF::label_traits,_true>
            (&local_388,(char (*) [5])0x1d9427,&local_3d0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_388);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  return;
}

Assistant:

ASDCP::MXF::ASDCP_MCAConfigParser::ASDCP_MCAConfigParser(const Dictionary* d) : m_Dict(d), m_ChannelCount(0)
{
  typedef mca_label_map_t::value_type pair;
  m_LabelMap.insert(pair("L",     label_traits("Left"                              , true,  m_Dict->ul(MDD_DCAudioChannel_L))));
  m_LabelMap.insert(pair("R",     label_traits("Right"                             , true,  m_Dict->ul(MDD_DCAudioChannel_R))));
  m_LabelMap.insert(pair("C",     label_traits("Center"                            , true,  m_Dict->ul(MDD_DCAudioChannel_C))));
  m_LabelMap.insert(pair("LFE",   label_traits("LFE"                               , true,  m_Dict->ul(MDD_DCAudioChannel_LFE))));
  m_LabelMap.insert(pair("Ls",    label_traits("Left Surround"                     , true,  m_Dict->ul(MDD_DCAudioChannel_Ls))));
  m_LabelMap.insert(pair("Rs",    label_traits("Right Surround"                    , true,  m_Dict->ul(MDD_DCAudioChannel_Rs))));
  m_LabelMap.insert(pair("Lss",   label_traits("Left Side Surround"                , true,  m_Dict->ul(MDD_DCAudioChannel_Lss))));
  m_LabelMap.insert(pair("Rss",   label_traits("Right Side Surround"               , true,  m_Dict->ul(MDD_DCAudioChannel_Rss))));
  m_LabelMap.insert(pair("Lrs",   label_traits("Left Rear Surround"                , true,  m_Dict->ul(MDD_DCAudioChannel_Lrs))));
  m_LabelMap.insert(pair("Rrs",   label_traits("Right Rear Surround"               , true,  m_Dict->ul(MDD_DCAudioChannel_Rrs))));
  m_LabelMap.insert(pair("Lc",    label_traits("Left Center"                       , true,  m_Dict->ul(MDD_DCAudioChannel_Lc))));
  m_LabelMap.insert(pair("Rc",    label_traits("Right Center"                      , true,  m_Dict->ul(MDD_DCAudioChannel_Rc))));
  m_LabelMap.insert(pair("Cs",    label_traits("Center Surround"                   , true,  m_Dict->ul(MDD_DCAudioChannel_Cs))));
  m_LabelMap.insert(pair("HI",    label_traits("Hearing Impaired"                  , true,  m_Dict->ul(MDD_DCAudioChannel_HI))));
  m_LabelMap.insert(pair("VIN",   label_traits("Visually Impaired-Narrative"       , true,  m_Dict->ul(MDD_DCAudioChannel_VIN))));
  m_LabelMap.insert(pair("51",    label_traits("5.1"                               , true,  m_Dict->ul(MDD_DCAudioSoundfield_51))));
  m_LabelMap.insert(pair("71",    label_traits("7.1DS"                             , true,  m_Dict->ul(MDD_DCAudioSoundfield_71))));
  m_LabelMap.insert(pair("SDS",   label_traits("7.1SDS"                            , true,  m_Dict->ul(MDD_DCAudioSoundfield_SDS))));
  m_LabelMap.insert(pair("61",    label_traits("6.1"                               , true,  m_Dict->ul(MDD_DCAudioSoundfield_61))));
  m_LabelMap.insert(pair("M",     label_traits("1.0 Monaural"                      , true,  m_Dict->ul(MDD_DCAudioSoundfield_M))));
  m_LabelMap.insert(pair("FSKSync",   label_traits("FSK Sync"                      , true,  m_Dict->ul(MDD_DCAudioChannel_FSKSyncSignalChannel))));
  m_LabelMap.insert(pair("DBOX",  label_traits("D-BOX Motion Code Primary Stream"  , false, m_Dict->ul(MDD_DBOXMotionCodePrimaryStream))));
  m_LabelMap.insert(pair("DBOX2", label_traits("D-BOX Motion Code Secondary Stream", false, m_Dict->ul(MDD_DBOXMotionCodeSecondaryStream))));
  m_LabelMap.insert(pair("SLVS",  label_traits("Sign Language Video Stream"        , false, m_Dict->ul(MDD_AudioChannelSLVS))));
}